

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool util::compareString(string *str1,char *str2)

{
  size_t sVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int i;
  bool bVar6;
  
  sVar1 = str1->_M_string_length;
  sVar5 = strlen(str2);
  if (sVar1 == sVar5) {
    pcVar2 = (str1->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar6 = sVar1 == sVar5;
      if (bVar6) {
        return bVar6;
      }
      iVar3 = tolower((int)pcVar2[sVar5]);
      iVar4 = tolower((int)str2[sVar5]);
      sVar5 = sVar5 + 1;
    } while (iVar3 == iVar4);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool util::compareString(const string &str1, const char* str2){
    if(str1.size() != strlen(str2))
        return false;
    for(int i = 0; i < str1.size(); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}